

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inc_search_demo.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  SquareCell gstate;
  bool bVar1;
  ostream *poVar2;
  reference pSVar3;
  SquareCell *e_1;
  iterator __end1_1;
  iterator __begin1_1;
  Path<SquareCell> *__range1_1;
  SquareCell *e;
  iterator __end1;
  iterator __begin1;
  Path<SquareCell> *__range1;
  Path<SquareCell> path2;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> sgraph2;
  Path<SquareCell> path;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> sgraph1;
  GetSquareCellNeighbour find_neighbours;
  vector<unsigned_long,_std::allocator<unsigned_long>_> obstacle_ids;
  SquareCell cell_g;
  SquareCell cell_s;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffcf8;
  vector<SquareCell,_std::allocator<SquareCell>_> *this;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd00;
  GetNeighbourFunc_t<SquareCell,_double> *get_neighbours;
  GetSquareCellNeighbour *in_stack_fffffffffffffd08;
  GetSquareCellNeighbour *__f;
  GetSquareCellNeighbour *in_stack_fffffffffffffd10;
  function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
  *pfVar4;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd50;
  __normal_iterator<SquareCell_*,_std::vector<SquareCell,_std::allocator<SquareCell>_>_> local_288;
  undefined1 *local_280;
  reference local_278;
  SquareCell *local_270;
  __normal_iterator<SquareCell_*,_std::vector<SquareCell,_std::allocator<SquareCell>_>_> local_268;
  undefined1 *local_260;
  function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
  *local_238;
  int64_t iStack_230;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *local_228;
  vector<SquareCell,_std::allocator<SquareCell>_> *local_218;
  undefined1 local_200 [16];
  SquareCell in_stack_fffffffffffffe10;
  GetNeighbourFunc_t<SquareCell,_double> *in_stack_fffffffffffffe28;
  CalcHeuristicFunc_t<SquareCell,_double> *in_stack_fffffffffffffe30;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *in_stack_fffffffffffffe38;
  SquareCell in_stack_fffffffffffffe50;
  SquareCell in_stack_fffffffffffffe68;
  undefined1 local_130 [152];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_60;
  SquareCell local_40;
  SquareCell local_28;
  int local_4;
  
  local_4 = 0;
  SquareCell::SquareCell(&local_28,0);
  local_28.idx.x = 0;
  local_28.idx.y = 0;
  SquareCell::SquareCell(&local_40,0x18);
  local_40.idx.x = 4;
  local_40.idx.y = 4;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1013a6);
  local_60 = 5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_stack_fffffffffffffd00,(value_type_conflict *)in_stack_fffffffffffffcf8);
  local_78 = 6;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_stack_fffffffffffffd00,(value_type_conflict *)in_stack_fffffffffffffcf8);
  local_80 = 7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_stack_fffffffffffffd00,(value_type_conflict *)in_stack_fffffffffffffcf8);
  local_88 = 0x11;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_stack_fffffffffffffd00,(value_type_conflict *)in_stack_fffffffffffffcf8);
  local_90 = 0x12;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_stack_fffffffffffffd00,(value_type_conflict *)in_stack_fffffffffffffcf8);
  local_98 = 0x13;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_stack_fffffffffffffd00,(value_type_conflict *)in_stack_fffffffffffffcf8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  GetSquareCellNeighbour::GetSquareCellNeighbour
            (in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
             (int)in_stack_fffffffffffffd08,(double)in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd10);
  xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Graph
            ((Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)0x1014cc);
  __f = (GetSquareCellNeighbour *)local_28.id;
  pfVar4 = (function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
            *)local_40.idx.x;
  std::function<double(SquareCell,SquareCell)>::function<double(&)(SquareCell,SquareCell),void>
            ((function<double_(SquareCell,_SquareCell)> *)in_stack_fffffffffffffd10,
             (_func_double_SquareCell_SquareCell *)in_stack_fffffffffffffd08);
  std::
  function<std::vector<std::tuple<SquareCell,double>,std::allocator<std::tuple<SquareCell,double>>>(SquareCell)>
  ::function<GetSquareCellNeighbour&,void>
            ((function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
              *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  xmotion::AStar::IncSearch<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>
            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe50,in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::
  function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
  ::~function((function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
               *)0x10159d);
  std::function<double_(SquareCell,_SquareCell)>::~function
            ((function<double_(SquareCell,_SquareCell)> *)0x1015aa);
  xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Graph
            ((Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)0x1015b7);
  local_218 = (vector<SquareCell,_std::allocator<SquareCell>_> *)local_28.idx.x;
  local_228 = (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)local_40.id;
  local_238 = (function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
               *)local_40.idx.x;
  iStack_230 = local_40.idx.y;
  get_neighbours = (GetNeighbourFunc_t<SquareCell,_double> *)local_28.idx.y;
  std::
  function<std::vector<std::tuple<SquareCell,double>,std::allocator<std::tuple<SquareCell,double>>>(SquareCell)>
  ::function<GetSquareCellNeighbour&,void>(pfVar4,__f);
  gstate.idx.y = (int64_t)in_stack_fffffffffffffe30;
  gstate.idx.x = (int64_t)in_stack_fffffffffffffe28;
  gstate.id = (int64_t)in_stack_fffffffffffffe38;
  this = local_218;
  pfVar4 = local_238;
  this_00 = local_228;
  xmotion::Dijkstra::IncSearch<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>
            ((Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)local_28.id,
             in_stack_fffffffffffffe10,gstate,get_neighbours);
  std::
  function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
  ::~function((function<std::vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>_(SquareCell)>
               *)0x10166c);
  poVar2 = std::operator<<((ostream *)&std::cout,"path a*: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_260 = local_130;
  local_268._M_current =
       (SquareCell *)std::vector<SquareCell,_std::allocator<SquareCell>_>::begin(this);
  local_270 = (SquareCell *)std::vector<SquareCell,_std::allocator<SquareCell>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<SquareCell_*,_std::vector<SquareCell,_std::allocator<SquareCell>_>_>
                        *)get_neighbours,
                       (__normal_iterator<SquareCell_*,_std::vector<SquareCell,_std::allocator<SquareCell>_>_>
                        *)this);
    if (!bVar1) break;
    local_278 = __gnu_cxx::
                __normal_iterator<SquareCell_*,_std::vector<SquareCell,_std::allocator<SquareCell>_>_>
                ::operator*(&local_268);
    poVar2 = std::operator<<((ostream *)&std::cout,"id: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_278->id);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<SquareCell_*,_std::vector<SquareCell,_std::allocator<SquareCell>_>_>::
    operator++(&local_268);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"path dijkstra: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_280 = local_200;
  local_288._M_current =
       (SquareCell *)std::vector<SquareCell,_std::allocator<SquareCell>_>::begin(this);
  std::vector<SquareCell,_std::allocator<SquareCell>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<SquareCell_*,_std::vector<SquareCell,_std::allocator<SquareCell>_>_>
                        *)get_neighbours,
                       (__normal_iterator<SquareCell_*,_std::vector<SquareCell,_std::allocator<SquareCell>_>_>
                        *)this);
    if (!bVar1) break;
    pSVar3 = __gnu_cxx::
             __normal_iterator<SquareCell_*,_std::vector<SquareCell,_std::allocator<SquareCell>_>_>
             ::operator*(&local_288);
    poVar2 = std::operator<<((ostream *)&std::cout,"id: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pSVar3->id);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<SquareCell_*,_std::vector<SquareCell,_std::allocator<SquareCell>_>_>::
    operator++(&local_288);
  }
  local_4 = 0;
  std::vector<SquareCell,_std::allocator<SquareCell>_>::~vector
            ((vector<SquareCell,_std::allocator<SquareCell>_> *)pfVar4);
  xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::~Graph(this_00);
  std::vector<SquareCell,_std::allocator<SquareCell>_>::~vector
            ((vector<SquareCell,_std::allocator<SquareCell>_> *)pfVar4);
  xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::~Graph(this_00);
  GetSquareCellNeighbour::~GetSquareCellNeighbour((GetSquareCellNeighbour *)0x101986);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pfVar4);
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
  SquareCell cell_s(0);
  cell_s.idx.x = 0;
  cell_s.idx.y = 0;

  SquareCell cell_g(24);
  cell_g.idx.x = 4;
  cell_g.idx.y = 4;

  std::vector<uint64_t> obstacle_ids;
  obstacle_ids.push_back(5);
  obstacle_ids.push_back(6);
  obstacle_ids.push_back(7);
  obstacle_ids.push_back(17);
  obstacle_ids.push_back(18);
  obstacle_ids.push_back(19);

  auto find_neighbours = GetSquareCellNeighbour(5, 5, 1.0, obstacle_ids);

  Graph<SquareCell, double> sgraph1;
  auto path = AStar::IncSearch(&sgraph1, cell_s, cell_g,
                               CalcHeuristicFunc_t<SquareCell>(CalcHeuristic),
                               GetNeighbourFunc_t<SquareCell>(find_neighbours));

  Graph<SquareCell, double> sgraph2;
  auto path2 =
      Dijkstra::IncSearch(&sgraph2, cell_s, cell_g,
                          GetNeighbourFunc_t<SquareCell>(find_neighbours));

  std::cout << "path a*: " << std::endl;
  for (auto &e : path) std::cout << "id: " << e.id << std::endl;
  std::cout << "path dijkstra: " << std::endl;
  for (auto &e : path2) std::cout << "id: " << e.id << std::endl;

  return 0;
}